

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

QBindingStatus * __thiscall
QtPrivate::BindingStatusOrList::addObjectUnlessAlreadyStatus
          (BindingStatusOrList *this,QObject *object)

{
  ulong uVar1;
  QBindingStatus *pQVar2;
  vector<QObject_*,_std::allocator<QObject_*>_> *this_00;
  long in_FS_OFFSET;
  QObject *object_local;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QBindingStatus *)(this->data).super___atomic_base<unsigned_long_long>._M_i;
  object_local = object;
  if (((ulong)pQVar2 & 1) != 0 || pQVar2 == (QBindingStatus *)0x0) {
    uVar1 = (this->data).super___atomic_base<unsigned_long_long>._M_i;
    this_00 = (vector<QObject_*,_std::allocator<QObject_*>_> *)(uVar1 & 0xfffffffffffffffe);
    if (((byte)uVar1 & this_00 != (vector<QObject_*,_std::allocator<QObject_*>_> *)0x0) == 0) {
      this_00 = (vector<QObject_*,_std::allocator<QObject_*>_> *)operator_new(0x18);
      (this_00->super__Vector_base<QObject_*,_std::allocator<QObject_*>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->super__Vector_base<QObject_*,_std::allocator<QObject_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->super__Vector_base<QObject_*,_std::allocator<QObject_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<QObject_*,_std::allocator<QObject_*>_>::reserve(this_00,8);
      (this->data).super___atomic_base<unsigned_long_long>._M_i = (ulong)this_00 | 1;
    }
    std::vector<QObject_*,_std::allocator<QObject_*>_>::push_back(this_00,&object_local);
    pQVar2 = (QBindingStatus *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QBindingStatus *QtPrivate::BindingStatusOrList::addObjectUnlessAlreadyStatus(QObject *object)
{
    if (auto status = bindingStatus())
        return status;
    List *objectList = list();
    if (!objectList) {
        objectList = new List();
        objectList->reserve(8);
        data.store(encodeList(objectList), std::memory_order_relaxed);
    }
    objectList->push_back(object);
    return nullptr;
}